

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlAttrHashInsert(xmlParserCtxtPtr ctxt,uint size,xmlChar *name,xmlChar *uri,uint hashValue,
                     int aindex)

{
  xmlChar *pxVar1;
  int iVar2;
  int nsIndex;
  xmlChar **atts;
  xmlAttrHashBucket *pxStack_48;
  uint hindex;
  xmlAttrHashBucket *bucket;
  xmlAttrHashBucket *table;
  int aindex_local;
  uint hashValue_local;
  xmlChar *uri_local;
  xmlChar *name_local;
  uint size_local;
  xmlParserCtxtPtr ctxt_local;
  
  atts._4_4_ = hashValue & size - 1;
  pxStack_48 = ctxt->attrHash + atts._4_4_;
  do {
    if (pxStack_48->index < 0) {
      pxStack_48->index = aindex;
      return 0x7fffffff;
    }
    if (name == ctxt->atts[pxStack_48->index]) {
      iVar2 = (int)(ctxt->atts + pxStack_48->index)[2];
      if (iVar2 == 0x7fffffff) {
        if (uri == (xmlChar *)0x0) {
LAB_00155cfa:
          return pxStack_48->index;
        }
      }
      else {
        if (iVar2 == 0x7ffffffe) {
          pxVar1 = ctxt->str_xml_ns;
        }
        else {
          pxVar1 = ctxt->nsTab[iVar2 * 2 + 1];
        }
        if (uri == pxVar1) goto LAB_00155cfa;
      }
    }
    atts._4_4_ = atts._4_4_ + 1;
    pxStack_48 = pxStack_48 + 1;
    if (size <= atts._4_4_) {
      atts._4_4_ = 0;
      pxStack_48 = ctxt->attrHash;
    }
  } while( true );
}

Assistant:

static int
xmlAttrHashInsert(xmlParserCtxtPtr ctxt, unsigned size, const xmlChar *name,
                  const xmlChar *uri, unsigned hashValue, int aindex) {
    xmlAttrHashBucket *table = ctxt->attrHash;
    xmlAttrHashBucket *bucket;
    unsigned hindex;

    hindex = hashValue & (size - 1);
    bucket = &table[hindex];

    while (bucket->index >= 0) {
        const xmlChar **atts = &ctxt->atts[bucket->index];

        if (name == atts[0]) {
            int nsIndex = XML_PTR_TO_INT(atts[2]);

            if ((nsIndex == NS_INDEX_EMPTY) ? (uri == NULL) :
                (nsIndex == NS_INDEX_XML) ? (uri == ctxt->str_xml_ns) :
                (uri == ctxt->nsTab[nsIndex * 2 + 1]))
                return(bucket->index);
        }

        hindex++;
        bucket++;
        if (hindex >= size) {
            hindex = 0;
            bucket = table;
        }
    }

    bucket->index = aindex;

    return(INT_MAX);
}